

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ld.h
# Opt level: O0

void __thiscall
LdSketchWrapper<4U>::Check
          (LdSketchWrapper<4U> *this,HashMap<4U> *mp,Abstract<4U> *another,
          vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
          *outs)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  pointer ppVar4;
  mapped_type *pmVar5;
  int *piVar6;
  const_reference ppbVar7;
  ostream *poVar8;
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *in_RCX;
  long *in_RDX;
  long *in_RDI;
  int size;
  int hit;
  int all;
  int value;
  iterator it;
  HashMap<4U> est2;
  HashMap<4U> est1;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffeb8;
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  *in_stack_fffffffffffffec0;
  double dVar9;
  int local_d0;
  int local_cc;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_c8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_c0;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  _Node_iterator_base<std::pair<const_Data<4U>,_int>,_true> local_98;
  undefined1 local_90 [56];
  undefined1 local_58 [56];
  vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
  *local_20;
  long *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x119ae6);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x119af3);
  std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::_Node_iterator
            ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x119b00);
  local_a8 = 0;
  local_ac = 0;
  local_b0 = 0;
  local_b4 = 0;
  local_c0._M_cur =
       (__node_type *)
       std::
       unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
       ::begin(in_stack_fffffffffffffeb8);
  local_98._M_cur = local_c0._M_cur;
  while( true ) {
    local_c8._M_cur =
         (__node_type *)
         std::
         unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
         ::end(in_stack_fffffffffffffeb8);
    bVar2 = std::__detail::operator!=(&local_98,&local_c8);
    if (!bVar2) break;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x119b8d);
    (**(code **)(*in_RDI + 8))(in_RDI,ppVar4,local_58);
    plVar1 = local_18;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x119bc2);
    (**(code **)(*plVar1 + 8))(plVar1,ppVar4,local_90);
    pmVar5 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
    iVar3 = *pmVar5;
    pmVar5 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
    local_cc = iVar3 - *pmVar5;
    if (local_cc < 1) {
      local_cc = -local_cc;
    }
    pmVar5 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
    iVar3 = *pmVar5;
    pmVar5 = std::
             unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
             ::operator[](in_stack_fffffffffffffec0,(key_type *)in_stack_fffffffffffffeb8);
    local_d0 = iVar3 - *pmVar5;
    if (local_d0 < 1) {
      local_d0 = -local_d0;
    }
    piVar6 = std::max<int>(&local_cc,&local_d0);
    local_a8 = *piVar6;
    ppVar4 = std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator->
                       ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)0x119cba);
    iVar3 = ppVar4->second;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    if (((int)in_RDI[0xd] < iVar3) && (local_ac = local_ac + 1, (int)in_RDI[0xd] < local_a8)) {
      local_b0 = local_b0 + 1;
    }
    if ((int)in_RDI[0xd] < local_a8) {
      local_b4 = local_b4 + 1;
    }
    std::__detail::_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true>::operator++
              ((_Node_iterator<std::pair<const_Data<4U>,_int>,_false,_true> *)
               in_stack_fffffffffffffec0);
  }
  in_RDI[6] = (long)((double)local_b0 / (double)local_ac);
  in_RDI[5] = (long)((double)local_b0 / (double)local_b4);
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,0);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar7,(double)in_RDI[6]);
  std::operator<<(poVar8,",");
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,1);
  poVar8 = (ostream *)std::ostream::operator<<((ostream *)*ppbVar7,(double)in_RDI[5]);
  std::operator<<(poVar8,",");
  ppbVar7 = std::
            vector<std::basic_ostream<char,_std::char_traits<char>_>_*,_std::allocator<std::basic_ostream<char,_std::char_traits<char>_>_*>_>
            ::operator[](local_20,2);
  if (1e-09 <= (double)in_RDI[5] + (double)in_RDI[6]) {
    dVar9 = (double)in_RDI[5] + (double)in_RDI[6];
  }
  else {
    dVar9 = 1.0;
  }
  poVar8 = (ostream *)
           std::ostream::operator<<
                     ((ostream *)*ppbVar7,((double)in_RDI[5] * 2.0 * (double)in_RDI[6]) / dVar9);
  std::operator<<(poVar8,",");
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x119ee0);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::~unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                    *)0x119eed);
  return;
}

Assistant:

void Check(HashMap<DATA_LEN> mp, Abstract<DATA_LEN>* another, const std::vector<std::ostream*>& outs) {
		HashMap<DATA_LEN> est1, est2;

		typename HashMap<DATA_LEN>::iterator it;
		int value = 0, all = 0, hit = 0, size = 0;
		for (it = mp.begin(); it != mp.end(); ++it) {
			Query(it->first, est1);
			another->Query(it->first, est2);

			value = max(abs(est1[up_key] - est2[low_key]),
				abs(est2[up_key] - est1[low_key]));
			if (abs(it->second) > this->HIT) {
				all++;
				if (value > this->HIT) {
					hit += 1;
				}
			}
			if (value > this->HIT) size += 1;
		}

		this->cr = hit / (double)all;
		this->pr = hit / (double)size;
		*outs[0] << this->cr << ",";
		*outs[1] << this->pr << ",";
		*outs[2] << 2 * this->pr * this->cr / ((this->pr + this->cr < 1e-9) ? 1.0 : this->pr + this->cr) << ",";
	}